

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_code.hpp
# Opt level: O1

bool __thiscall
boost::system::error_category::std_category::equivalent
          (std_category *this,int code,error_condition *condition)

{
  error_category *peVar1;
  undefined1 uVar2;
  int iVar3;
  error_category *peVar4;
  long lVar5;
  _func_int **pp_Var6;
  error_category *extraout_RDX;
  ulong uVar7;
  error_code bc;
  error_condition bn;
  uint local_48 [2];
  error_category *local_40;
  int local_38;
  long *local_30;
  
  uVar7 = (ulong)(uint)code;
  iVar3 = (**(code **)(*(long *)this + 0x28))();
  peVar1 = condition->_M_cat;
  if ((extraout_RDX == peVar1) && (iVar3 == condition->_M_value)) {
    return true;
  }
  peVar4 = (error_category *)std::_V2::generic_category();
  local_48[0] = code;
  if (peVar1 != peVar4) {
    if (generic_category()::generic_category_const == '\0') {
      equivalent();
    }
    if (peVar1 != (error_category *)&DAT_00105148) {
      lVar5 = __dynamic_cast(condition->_M_cat,&std::_V2::error_category::typeinfo,&typeinfo,0);
      if (lVar5 == 0) {
        return false;
      }
      local_40 = this->pc_;
      local_30 = *(long **)(lVar5 + 8);
      pp_Var6 = local_40->_vptr_error_category;
      local_38 = condition->_M_value;
      goto LAB_00102d24;
    }
  }
  local_40 = this->pc_;
  iVar3 = condition->_M_value;
  if (generic_category()::generic_category_const == '\0') {
    equivalent();
  }
  local_30 = &generic_category()::generic_category_const;
  uVar7 = (ulong)local_48[0];
  pp_Var6 = local_40->_vptr_error_category;
  local_38 = iVar3;
LAB_00102d24:
  iVar3 = (*pp_Var6[5])(local_40,uVar7);
  uVar2 = 1;
  if ((char)iVar3 == '\0') {
    uVar2 = (**(code **)(*local_30 + 0x30))(local_30,local_48,local_38);
  }
  return (bool)uVar2;
}

Assistant:

inline bool error_category::std_category::equivalent( int code,
      const std::error_condition & condition ) const BOOST_NOEXCEPT
    {
      if( default_error_condition( code ) == condition )
      {
        return true;
      }
      else if( condition.category() == std::generic_category()
        || condition.category() == boost::system::generic_category() )
      {
        boost::system::error_code bc( code, *pc_ );
        boost::system::error_condition bn( condition.value(),
          boost::system::generic_category() );

        return bc == bn;
      }
#ifndef BOOST_NO_RTTI
      else if( std_category const* pc2 = dynamic_cast< std_category const* >(
        &condition.category() ) )
      {
        boost::system::error_code bc( code, *pc_ );
        boost::system::error_condition bn( condition.value(), *pc2->pc_ );

        return bc == bn;
      }
#endif
      else
      {
        return false;
      }
    }